

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

int crnlib::MatchFinder_Create
              (CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,UInt32 matchMaxLen,
              UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  UInt32 UVar1;
  UInt32 UVar2;
  int iVar3;
  uint uVar4;
  UInt32 num;
  CLzRef *pCVar5;
  UInt32 local_48;
  UInt32 newSize;
  UInt32 prevSize;
  UInt32 hs;
  UInt32 newCyclicBufferSize;
  UInt32 sizeReserv;
  ISzAlloc *alloc_local;
  UInt32 keepAddBufferAfter_local;
  UInt32 matchMaxLen_local;
  UInt32 keepAddBufferBefore_local;
  UInt32 historySize_local;
  CMatchFinder *p_local;
  
  if (0xc0000000 < historySize) {
    MatchFinder_Free(p,alloc);
    return 0;
  }
  hs = historySize >> 1;
  if (0x80000000 < historySize) {
    hs = historySize >> 2;
  }
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  iVar3 = LzInWindow_Create(p,(keepAddBufferBefore + matchMaxLen + keepAddBufferAfter >> 1) +
                              0x80000 + hs,alloc);
  if (iVar3 != 0) {
    local_48 = historySize + 1;
    p->matchMaxLen = matchMaxLen;
    p->fixedHashSize = 0;
    if (p->numHashBytes == 2) {
      newSize = 0xffff;
    }
    else {
      uVar4 = historySize - 1 >> 1 | historySize - 1;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      newSize = (uVar4 >> 8 | uVar4) >> 1 | 0xffff;
      if (0x1000000 < newSize) {
        if (p->numHashBytes == 3) {
          newSize = 0xffffff;
        }
        else {
          newSize = newSize >> 1;
        }
      }
    }
    p->hashMask = newSize;
    if (2 < p->numHashBytes) {
      p->fixedHashSize = p->fixedHashSize + 0x400;
    }
    if (3 < p->numHashBytes) {
      p->fixedHashSize = p->fixedHashSize + 0x10000;
    }
    if (4 < p->numHashBytes) {
      p->fixedHashSize = p->fixedHashSize + 0x100000;
    }
    UVar1 = p->hashSizeSum;
    UVar2 = p->numSons;
    p->historySize = historySize;
    p->hashSizeSum = p->fixedHashSize + newSize + 1;
    p->cyclicBufferSize = local_48;
    if (p->btMode != 0) {
      local_48 = local_48 * 2;
    }
    p->numSons = local_48;
    num = p->hashSizeSum + p->numSons;
    if ((p->hash != (CLzRef *)0x0) && (UVar1 + UVar2 == num)) {
      return 1;
    }
    MatchFinder_FreeThisClassMemory(p,alloc);
    pCVar5 = AllocRefs(num,alloc);
    p->hash = pCVar5;
    if (p->hash != (CLzRef *)0x0) {
      p->son = p->hash + p->hashSizeSum;
      return 1;
    }
  }
  MatchFinder_Free(p,alloc);
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder* p, UInt32 historySize,
                       UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
                       ISzAlloc* alloc) {
  UInt32 sizeReserv;
  if (historySize > kMaxHistorySize) {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  sizeReserv = historySize >> 1;
  if (historySize > ((UInt32)2 << 30))
    sizeReserv = historySize >> 2;
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  if (LzInWindow_Create(p, sizeReserv, alloc)) {
    UInt32 newCyclicBufferSize = (historySize /* >> p->skipModeBits */) + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        /* hs >>= p->skipModeBits; */
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24)) {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2)
        p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3)
        p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4)
        p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      UInt32 prevSize = p->hashSizeSum + p->numSons;
      UInt32 newSize;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      p->numSons = (p->btMode ? newCyclicBufferSize * 2 : newCyclicBufferSize);
      newSize = p->hashSizeSum + p->numSons;
      if (p->hash != 0 && prevSize == newSize)
        return 1;
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->hash = AllocRefs(newSize, alloc);
      if (p->hash != 0) {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }
  MatchFinder_Free(p, alloc);
  return 0;
}